

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search.c
# Opt level: O0

int cfl_rd_pick_alpha(MACROBLOCK *x,AV1_COMP *cpi,TX_SIZE tx_size,int64_t ref_best_rd,
                     int cfl_search_range,RD_STATS *best_rd_stats,uint8_t *best_cfl_alpha_idx,
                     int8_t *best_cfl_alpha_signs)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  long in_RCX;
  long in_RDI;
  int in_R8D;
  RD_STATS *in_R9;
  uint8_t *in_stack_00000008;
  int8_t *in_stack_00000010;
  RD_STATS rd_stats;
  int joint_sign_1;
  CFL_SIGN_TYPE cfl_sign_v_1;
  int cfl_alpha_v_1;
  int vi;
  CFL_SIGN_TYPE cfl_sign_u_1;
  int cfl_alpha_u_1;
  int ui;
  int rate_overhead;
  int joint_sign;
  MB_MODE_INFO *mbmi;
  CFL_SIGN_TYPE cfl_sign_v;
  CFL_SIGN_TYPE cfl_sign_u;
  int cfl_alpha_v;
  int cfl_alpha_u;
  int est_best_cfl_idx_v;
  int est_best_cfl_idx_u;
  MACROBLOCKD *xd;
  RD_STATS cfl_rd_arr_v [33];
  RD_STATS cfl_rd_arr_u [33];
  ModeCosts *mode_costs;
  int iVar4;
  undefined4 in_stack_fffffffffffff4dc;
  RD_STATS *in_stack_fffffffffffff4e0;
  int local_b10 [2];
  MACROBLOCKD *in_stack_fffffffffffff4f8;
  long local_b00;
  undefined4 in_stack_fffffffffffff520;
  int in_stack_fffffffffffff524;
  int local_ad8;
  int in_stack_fffffffffffff52c;
  byte bVar5;
  int in_stack_fffffffffffff530;
  int in_stack_fffffffffffff534;
  int iVar6;
  int in_stack_fffffffffffff538;
  int in_stack_fffffffffffff53c;
  AV1_COMP *in_stack_fffffffffffff540;
  undefined6 in_stack_fffffffffffff548;
  byte in_stack_fffffffffffff54e;
  byte in_stack_fffffffffffff54f;
  int in_stack_fffffffffffff550;
  int local_aac;
  int local_aa8;
  int local_aa4;
  long local_aa0;
  int local_a98 [332];
  int local_568 [330];
  long local_40;
  RD_STATS *local_38;
  int local_2c;
  long local_28;
  long local_10;
  uint local_4;
  
  local_40 = in_RDI + 0x4230;
  local_aa0 = in_RDI + 0x1a0;
  local_38 = in_R9;
  local_2c = in_R8D;
  local_28 = in_RCX;
  local_10 = in_RDI;
  av1_invalid_rd_stats(in_R9);
  *(undefined1 *)(local_aa0 + 0x3a1a) = 1;
  local_aa4 = cfl_pick_plane_parameter
                        ((AV1_COMP *)
                         CONCAT17(in_stack_fffffffffffff54f,
                                  CONCAT16(in_stack_fffffffffffff54e,in_stack_fffffffffffff548)),
                         (MACROBLOCK *)in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                         (TX_SIZE)((uint)in_stack_fffffffffffff538 >> 0x18),
                         in_stack_fffffffffffff534);
  local_aa8 = cfl_pick_plane_parameter
                        ((AV1_COMP *)
                         CONCAT17(in_stack_fffffffffffff54f,
                                  CONCAT16(in_stack_fffffffffffff54e,in_stack_fffffffffffff548)),
                         (MACROBLOCK *)in_stack_fffffffffffff540,in_stack_fffffffffffff53c,
                         (TX_SIZE)((uint)in_stack_fffffffffffff538 >> 0x18),
                         in_stack_fffffffffffff534);
  if (local_2c == 1) {
    if ((local_aa4 == 0x10) && (local_aa8 == 0x10)) {
      set_invalid_cfl_parameters(in_stack_00000008,in_stack_00000010);
      clear_cfl_dc_pred_cache_flags((CFL_CTX *)(local_aa0 + 0x2a18));
      return 0;
    }
    in_stack_fffffffffffff540 = (AV1_COMP *)**(long **)(local_aa0 + 0x1eb8);
    cfl_idx_to_sign_and_alpha(local_aa4,&stack0xfffffffffffff54f,&local_aac);
    cfl_idx_to_sign_and_alpha(local_aa8,&stack0xfffffffffffff54e,(int *)&stack0xfffffffffffff550);
    in_stack_fffffffffffff53c =
         (uint)in_stack_fffffffffffff54f * 3 + (uint)in_stack_fffffffffffff54e + -1;
    iVar4 = *(int *)(local_40 + 0x2d98 + (long)in_stack_fffffffffffff53c * 0x80 +
                    (long)local_aac * 4);
    iVar6 = *(int *)(local_40 + (long)in_stack_fffffffffffff53c * 0x80 + 0x2dd8 +
                    (long)in_stack_fffffffffffff550 * 4);
    in_stack_fffffffffffff4e0 = (RD_STATS *)(local_40 + 0x2644);
    bVar2 = is_cfl_allowed(in_stack_fffffffffffff4f8);
    in_stack_fffffffffffff538 =
         iVar4 + iVar6 +
         *(int *)((long)in_stack_fffffffffffff4e0 +
                 (ulong)*(byte *)((long)&in_stack_fffffffffffff540->ppi + 2) * 0x38 +
                 (ulong)bVar2 * 0x2d8 + 0x34);
    if (local_28 < (long)in_stack_fffffffffffff538 * (long)*(int *)(local_10 + 0x4218) + 0x100 >> 9)
    {
      set_invalid_cfl_parameters(in_stack_00000008,in_stack_00000010);
      clear_cfl_dc_pred_cache_flags((CFL_CTX *)(local_aa0 + 0x2a18));
      return 0;
    }
  }
  cfl_pick_plane_rd(in_stack_fffffffffffff540,
                    (MACROBLOCK *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                    in_stack_fffffffffffff534,(TX_SIZE)((uint)in_stack_fffffffffffff530 >> 0x18),
                    in_stack_fffffffffffff52c,
                    (RD_STATS *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                    in_stack_fffffffffffff550);
  iVar4 = local_aa8;
  cfl_pick_plane_rd(in_stack_fffffffffffff540,
                    (MACROBLOCK *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538),
                    in_stack_fffffffffffff534,(TX_SIZE)((uint)in_stack_fffffffffffff530 >> 0x18),
                    in_stack_fffffffffffff52c,
                    (RD_STATS *)CONCAT44(in_stack_fffffffffffff524,in_stack_fffffffffffff520),
                    in_stack_fffffffffffff550);
  clear_cfl_dc_pred_cache_flags((CFL_CTX *)(local_aa0 + 0x2a18));
  for (iVar6 = 0; iVar6 < 0x21; iVar6 = iVar6 + 1) {
    if (local_568[(long)iVar6 * 10] != 0x7fffffff) {
      cfl_idx_to_sign_and_alpha(iVar6,&stack0xfffffffffffff52f,(int *)&stack0xfffffffffffff530);
      for (local_ad8 = 0; local_ad8 < 0x21; local_ad8 = local_ad8 + 1) {
        if (local_a98[(long)local_ad8 * 10] != 0x7fffffff) {
          cfl_idx_to_sign_and_alpha
                    (local_ad8,&stack0xfffffffffffff523,(int *)&stack0xfffffffffffff524);
          bVar5 = (byte)((uint)in_stack_fffffffffffff52c >> 0x18);
          bVar2 = (byte)((uint)in_stack_fffffffffffff520 >> 0x18);
          if ((bVar5 != 0) || (bVar2 != 0)) {
            iVar3 = (uint)bVar5 * 3 + (uint)bVar2 + -1;
            memcpy(local_b10,local_568 + (long)iVar6 * 10,0x28);
            av1_merge_rd_stats(in_stack_fffffffffffff4e0,
                               (RD_STATS *)CONCAT44(in_stack_fffffffffffff4dc,iVar4));
            if (local_b10[0] != 0x7fffffff) {
              local_b10[0] = *(int *)(local_40 + (long)iVar3 * 0x80 + 0x2dd8 +
                                     (long)in_stack_fffffffffffff524 * 4) +
                             *(int *)(local_40 + 0x2d98 + (long)iVar3 * 0x80 +
                                     (long)in_stack_fffffffffffff530 * 4) + local_b10[0];
            }
            av1_rd_cost_update((int)((ulong)in_stack_fffffffffffff4e0 >> 0x20),
                               (RD_STATS *)CONCAT44(in_stack_fffffffffffff4dc,iVar4));
            if (local_b00 < local_38->rdcost) {
              memcpy(local_38,local_b10,0x28);
              *in_stack_00000008 =
                   (char)(in_stack_fffffffffffff530 << 4) + (char)in_stack_fffffffffffff524;
              *in_stack_00000010 = (int8_t)iVar3;
            }
          }
        }
      }
    }
  }
  bVar1 = local_38->rdcost < local_28;
  if (!bVar1) {
    av1_invalid_rd_stats(local_38);
    set_invalid_cfl_parameters(in_stack_00000008,in_stack_00000010);
  }
  local_4 = (uint)bVar1;
  return local_4;
}

Assistant:

static int cfl_rd_pick_alpha(MACROBLOCK *const x, const AV1_COMP *const cpi,
                             TX_SIZE tx_size, int64_t ref_best_rd,
                             int cfl_search_range, RD_STATS *best_rd_stats,
                             uint8_t *best_cfl_alpha_idx,
                             int8_t *best_cfl_alpha_signs) {
  assert(cfl_search_range >= 1 && cfl_search_range <= CFL_MAGS_SIZE);
  const ModeCosts *mode_costs = &x->mode_costs;
  RD_STATS cfl_rd_arr_u[CFL_MAGS_SIZE];
  RD_STATS cfl_rd_arr_v[CFL_MAGS_SIZE];
  MACROBLOCKD *const xd = &x->e_mbd;
  int est_best_cfl_idx_u, est_best_cfl_idx_v;

  av1_invalid_rd_stats(best_rd_stats);

  // As the dc pred data is same for different values of alpha, enable the
  // caching of dc pred data. Call clear_cfl_dc_pred_cache_flags() before
  // returning to avoid the unintentional usage of cached dc pred data.
  xd->cfl.use_dc_pred_cache = true;
  // Evaluate alpha parameter of each chroma plane.
  est_best_cfl_idx_u =
      cfl_pick_plane_parameter(cpi, x, 1, tx_size, cfl_search_range);
  est_best_cfl_idx_v =
      cfl_pick_plane_parameter(cpi, x, 2, tx_size, cfl_search_range);

  if (cfl_search_range == 1) {
    // For cfl_search_range=1, further refinement of alpha is not enabled. Hence
    // CfL index=0 for both the chroma planes implies invalid CfL mode.
    if (est_best_cfl_idx_u == CFL_INDEX_ZERO &&
        est_best_cfl_idx_v == CFL_INDEX_ZERO) {
      set_invalid_cfl_parameters(best_cfl_alpha_idx, best_cfl_alpha_signs);
      clear_cfl_dc_pred_cache_flags(&xd->cfl);
      return 0;
    }

    int cfl_alpha_u, cfl_alpha_v;
    CFL_SIGN_TYPE cfl_sign_u, cfl_sign_v;
    const MB_MODE_INFO *mbmi = xd->mi[0];
    cfl_idx_to_sign_and_alpha(est_best_cfl_idx_u, &cfl_sign_u, &cfl_alpha_u);
    cfl_idx_to_sign_and_alpha(est_best_cfl_idx_v, &cfl_sign_v, &cfl_alpha_v);
    const int joint_sign = cfl_sign_u * CFL_SIGNS + cfl_sign_v - 1;
    // Compute alpha and mode signaling rate.
    const int rate_overhead =
        mode_costs->cfl_cost[joint_sign][CFL_PRED_U][cfl_alpha_u] +
        mode_costs->cfl_cost[joint_sign][CFL_PRED_V][cfl_alpha_v] +
        mode_costs
            ->intra_uv_mode_cost[is_cfl_allowed(xd)][mbmi->mode][UV_CFL_PRED];
    // Skip the CfL mode evaluation if the RD cost derived using the rate needed
    // to signal the CfL mode and alpha parameter exceeds the ref_best_rd.
    if (RDCOST(x->rdmult, rate_overhead, 0) > ref_best_rd) {
      set_invalid_cfl_parameters(best_cfl_alpha_idx, best_cfl_alpha_signs);
      clear_cfl_dc_pred_cache_flags(&xd->cfl);
      return 0;
    }
  }

  // Compute the rd cost of each chroma plane using the alpha parameters which
  // were already evaluated.
  cfl_pick_plane_rd(cpi, x, 1, tx_size, cfl_search_range, cfl_rd_arr_u,
                    est_best_cfl_idx_u);
  cfl_pick_plane_rd(cpi, x, 2, tx_size, cfl_search_range, cfl_rd_arr_v,
                    est_best_cfl_idx_v);

  clear_cfl_dc_pred_cache_flags(&xd->cfl);

  for (int ui = 0; ui < CFL_MAGS_SIZE; ++ui) {
    if (cfl_rd_arr_u[ui].rate == INT_MAX) continue;
    int cfl_alpha_u;
    CFL_SIGN_TYPE cfl_sign_u;
    cfl_idx_to_sign_and_alpha(ui, &cfl_sign_u, &cfl_alpha_u);
    for (int vi = 0; vi < CFL_MAGS_SIZE; ++vi) {
      if (cfl_rd_arr_v[vi].rate == INT_MAX) continue;
      int cfl_alpha_v;
      CFL_SIGN_TYPE cfl_sign_v;
      cfl_idx_to_sign_and_alpha(vi, &cfl_sign_v, &cfl_alpha_v);
      // cfl_sign_u == CFL_SIGN_ZERO && cfl_sign_v == CFL_SIGN_ZERO is not a
      // valid parameter for CFL
      if (cfl_sign_u == CFL_SIGN_ZERO && cfl_sign_v == CFL_SIGN_ZERO) continue;
      int joint_sign = cfl_sign_u * CFL_SIGNS + cfl_sign_v - 1;
      RD_STATS rd_stats = cfl_rd_arr_u[ui];
      av1_merge_rd_stats(&rd_stats, &cfl_rd_arr_v[vi]);
      if (rd_stats.rate != INT_MAX) {
        rd_stats.rate +=
            mode_costs->cfl_cost[joint_sign][CFL_PRED_U][cfl_alpha_u];
        rd_stats.rate +=
            mode_costs->cfl_cost[joint_sign][CFL_PRED_V][cfl_alpha_v];
      }
      av1_rd_cost_update(x->rdmult, &rd_stats);
      if (rd_stats.rdcost < best_rd_stats->rdcost) {
        *best_rd_stats = rd_stats;
        *best_cfl_alpha_idx =
            (cfl_alpha_u << CFL_ALPHABET_SIZE_LOG2) + cfl_alpha_v;
        *best_cfl_alpha_signs = joint_sign;
      }
    }
  }
  if (best_rd_stats->rdcost >= ref_best_rd) {
    av1_invalid_rd_stats(best_rd_stats);
    // Set invalid CFL parameters here since the rdcost is not better than
    // ref_best_rd.
    set_invalid_cfl_parameters(best_cfl_alpha_idx, best_cfl_alpha_signs);
    return 0;
  }
  return 1;
}